

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3)

{
  Operand_ *extraOp;
  ZoneHeap *this_00;
  uint32_t uVar1;
  Zone *pZVar2;
  anon_union_8_2_78723da6_for_MemData_2 aVar3;
  Error EVar4;
  int iVar5;
  CBNode *node;
  CBNode **ppCVar6;
  void **ppvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar8;
  ushort uVar9;
  undefined1 uVar10;
  uint options;
  ulong uVar11;
  CBNode **ppCVar12;
  uint opCount;
  Operand opArray [4];
  StringBuilderTmp<256UL> sb;
  
  options = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._globalOptions |
            (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options;
  pcVar8 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment;
  opCount = ((((uint)((undefined1  [16])((undefined1  [16])o1->field_0 & (undefined1  [16])0x7) !=
                     (undefined1  [16])0x0) -
              (uint)((undefined1  [16])((undefined1  [16])o0->field_0 & (undefined1  [16])0x7) ==
                    (undefined1  [16])0x0)) -
             (uint)((undefined1  [16])((undefined1  [16])o2->field_0 & (undefined1  [16])0x7) ==
                   (undefined1  [16])0x0)) + 3) -
            (uint)((undefined1  [16])((undefined1  [16])o3->field_0 & (undefined1  [16])0x7) ==
                  (undefined1  [16])0x0);
  if ((options & 3) != 0) {
    EVar4 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
    if (EVar4 != 0) {
      return EVar4;
    }
    if ((options & 2) != 0) {
      opArray[0].super_Operand_.field_0._0_8_ = (o0->field_0)._packed[0];
      opArray[0].super_Operand_.field_0._8_8_ = (o0->field_0)._mem.field_2;
      opArray[1].super_Operand_.field_0._0_8_ = (o1->field_0)._packed[0];
      opArray[1].super_Operand_.field_0._8_8_ = (o1->field_0)._mem.field_2;
      opArray[2].super_Operand_.field_0._0_8_ = (o2->field_0)._packed[0];
      opArray[2].super_Operand_.field_0._8_8_ = (o2->field_0)._mem.field_2;
      opArray[3].super_Operand_.field_0._0_8_ = (o3->field_0)._packed[0];
      opArray[3].super_Operand_.field_0._8_8_ = (o3->field_0)._mem.field_2;
      extraOp = &(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp;
      EVar4 = X86Inst::validate((uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter
                                      ._codeInfo._archInfo.field_0.field_0._type,instId,options,
                                extraOp,&opArray[0].super_Operand_,opCount);
      if (EVar4 != 0) {
        sb.super_StringBuilder._data = sb._embeddedData;
        sb._embeddedData[0] = '\0';
        sb.super_StringBuilder._length = 0;
        sb.super_StringBuilder._capacity = 0x100;
        sb.super_StringBuilder._canFree = 0;
        pcVar8 = DebugUtils::errorAsString(EVar4);
        StringBuilder::_opString(&sb.super_StringBuilder,1,pcVar8,0xffffffffffffffff);
        StringBuilder::_opString(&sb.super_StringBuilder,1,": ",0xffffffffffffffff);
        Logging::formatInstruction
                  (&sb.super_StringBuilder,0,(CodeEmitter *)this,
                   (uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._codeInfo.
                         _archInfo.field_0.field_0._type,instId,options,extraOp,
                   &opArray[0].super_Operand_,opCount);
        EVar4 = CodeEmitter::setLastError((CodeEmitter *)this,EVar4,sb.super_StringBuilder._data);
        StringBuilder::~StringBuilder(&sb.super_StringBuilder);
        return EVar4;
      }
      options = options & 0xfffffffd;
    }
  }
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment = (char *)0x0;
  this_00 = &(this->super_CodeCompiler).super_CodeBuilder._cbHeap;
  pZVar2 = (this->super_CodeCompiler).super_CodeBuilder._cbHeap._zone;
  if (instId - 0x113 < 0x20 || instId - 0x176 < 3) {
    if (pZVar2 == (Zone *)0x0) {
      _emit();
LAB_00120c43:
      _emit();
    }
    else {
      node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(opCount * 0x10 + 0x58),(size_t *)&sb);
      if (node != (CBNode *)0x0) {
        ppCVar6 = &node[2]._next;
        if (opCount != 0) {
          aVar3 = (o0->field_0)._mem.field_2;
          *ppCVar6 = (CBNode *)(o0->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar3;
          if (opCount != 1) {
            aVar3 = (o1->field_0)._mem.field_2;
            node[2]._inlineComment = (char *)(o1->field_0)._packed[0];
            node[2]._passData = (void *)aVar3;
            if (2 < opCount) {
              aVar3 = (o2->field_0)._mem.field_2;
              node[3]._prev = (CBNode *)(o2->field_0)._packed[0];
              node[3]._next = (CBNode *)aVar3;
              if (opCount != 3) {
                aVar3 = (o3->field_0)._mem.field_2;
                *(UInt64 *)&node[3]._type = (o3->field_0)._packed[0];
                node[3]._inlineComment = (char *)aVar3;
              }
            }
          }
        }
        node->_prev = (CBNode *)0x0;
        node->_next = (CBNode *)0x0;
        node->_type = '\x01';
        uVar1 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
        node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
        node->_inlineComment = (char *)0x0;
        node->_passData = (void *)0x0;
        node[1]._next = (CBNode *)0x0;
        node[1]._type = '\0';
        node[1]._opCount = '\0';
        node[1]._flags = 0;
        node[1]._position = 0;
        node->_flags = (ushort)uVar1 | 4;
        *(short *)&node[1]._prev = (short)instId;
        *(undefined1 *)((long)&node[1]._prev + 3) = 0;
        *(uint *)((long)&node[1]._prev + 4) = options;
        node->_opCount = (uint8_t)opCount;
        node[1]._inlineComment = (char *)ppCVar6;
        uVar10 = 0xff;
        if (opCount != 0) {
          uVar11 = 0;
          ppCVar12 = ppCVar6;
          do {
            if (((ulong)*ppCVar12 & 7) == 2) {
              uVar10 = (undefined1)uVar11;
              break;
            }
            uVar11 = uVar11 + 1;
            ppCVar12 = ppCVar12 + 2;
          } while (opCount != uVar11);
        }
        *(undefined1 *)((long)&node[1]._prev + 2) = uVar10;
        node[1]._passData = (void *)0x0;
        node[2]._prev = (CBNode *)0x0;
        aVar3 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._mem
                .field_2;
        node[1]._next =
             (CBNode *)
             (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._packed
             [0];
        *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1]._type = aVar3;
        (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._packed[0] =
             (UInt64)0x0;
        (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._mem.field_2
        .offset64 = 0;
        sb.super_StringBuilder._data = (char *)0x0;
        if ((options & 0x10) == 0) {
          if (((ulong)*ppCVar6 & 7) == 4) {
            EVar4 = CodeBuilder::getCBLabel
                              ((CodeBuilder *)this,(CBLabel **)&sb,
                               *(uint32_t *)((long)&node[2]._next + 4));
            if (EVar4 != 0) goto LAB_00120a17;
          }
          else {
            options = options | 0x10;
          }
        }
        *(uint *)((long)&node[1]._prev + 4) = options;
        uVar9 = 0x50;
        if (instId != 0x11e) {
          uVar9 = 0x20;
        }
        uVar9 = uVar9 | node->_flags;
        node->_flags = uVar9;
        node[1]._passData = sb.super_StringBuilder._data;
        node[2]._prev = (CBNode *)0x0;
        if (sb.super_StringBuilder._data != (char *)0x0) {
          node[2]._prev = *(CBNode **)(sb.super_StringBuilder._data + 0x30);
          *(CBNode **)(sb.super_StringBuilder._data + 0x30) = node;
          *(int *)(sb.super_StringBuilder._data + 0x2c) =
               *(int *)(sb.super_StringBuilder._data + 0x2c) + 1;
        }
        if ((instId == 0x11e) || ((options & 0x100) != 0)) {
          node->_flags = uVar9 | 0x40;
        }
        if (pcVar8 != (char *)0x0) {
          strlen(pcVar8);
          iVar5 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)pcVar8);
          node->_inlineComment = (char *)CONCAT44(extraout_var_00,iVar5);
        }
LAB_00120b03:
        CodeBuilder::addNode((CodeBuilder *)this,node);
        return 0;
      }
    }
  }
  else {
    if (pZVar2 == (Zone *)0x0) goto LAB_00120c43;
    node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(opCount * 0x10 + 0x48),(size_t *)&sb);
    if (node != (CBNode *)0x0) {
      ppvVar7 = &node[1]._passData;
      if (opCount != 0) {
        aVar3 = (o0->field_0)._mem.field_2;
        *ppvVar7 = (void *)(o0->field_0)._packed[0];
        node[2]._prev = (CBNode *)aVar3;
        if (opCount != 1) {
          aVar3 = (o1->field_0)._mem.field_2;
          node[2]._next = (CBNode *)(o1->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar3;
          if (2 < opCount) {
            aVar3 = (o2->field_0)._mem.field_2;
            node[2]._inlineComment = (char *)(o2->field_0)._packed[0];
            node[2]._passData = (void *)aVar3;
            if (opCount != 3) {
              aVar3 = (o3->field_0)._mem.field_2;
              node[3]._prev = (CBNode *)(o3->field_0)._packed[0];
              node[3]._next = (CBNode *)aVar3;
            }
          }
        }
      }
      node->_prev = (CBNode *)0x0;
      node->_next = (CBNode *)0x0;
      node->_type = '\x01';
      uVar1 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
      node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
      node->_inlineComment = (char *)0x0;
      node->_passData = (void *)0x0;
      node[1]._next = (CBNode *)0x0;
      node[1]._type = '\0';
      node[1]._opCount = '\0';
      node[1]._flags = 0;
      node[1]._position = 0;
      node->_flags = (ushort)uVar1 | 4;
      *(short *)&node[1]._prev = (short)instId;
      *(undefined1 *)((long)&node[1]._prev + 3) = 0;
      *(uint *)((long)&node[1]._prev + 4) = options;
      node->_opCount = (uint8_t)opCount;
      node[1]._inlineComment = (char *)ppvVar7;
      uVar10 = 0xff;
      if (opCount != 0) {
        uVar11 = 0;
        do {
          if (((ulong)*ppvVar7 & 7) == 2) {
            uVar10 = (undefined1)uVar11;
            break;
          }
          uVar11 = uVar11 + 1;
          ppvVar7 = ppvVar7 + 2;
        } while (opCount != uVar11);
      }
      *(undefined1 *)((long)&node[1]._prev + 2) = uVar10;
      aVar3 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._mem.
              field_2;
      node[1]._next =
           (CBNode *)
           (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._packed
           [0];
      *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1]._type = aVar3;
      (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._packed[0] =
           (UInt64)0x0;
      (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraOp.field_0._mem.field_2.
      offset64 = 0;
      if (pcVar8 != (char *)0x0) {
        strlen(pcVar8);
        iVar5 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)pcVar8);
        node->_inlineComment = (char *)CONCAT44(extraout_var,iVar5);
      }
      goto LAB_00120b03;
    }
  }
  EVar4 = 1;
LAB_00120a17:
  EVar4 = CodeEmitter::setLastError((CodeEmitter *)this,EVar4,(char *)0x0);
  return EVar4;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter is in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3)
      };

      Error err = X86Inst::validate(getArchType(), instId, options, _extraOp, opArray, opCount);
      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instId, options, _extraOp, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_extraOp = _extraOp;
    _extraOp.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_extraOp = _extraOp;
    _extraOp.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}